

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O2

int mbedtls_rsa_write_pubkey(mbedtls_rsa_context *rsa,uchar *start,uchar **p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong len;
  mbedtls_mpi T;
  
  mbedtls_mpi_init(&T);
  len = 0;
  uVar1 = mbedtls_rsa_export(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                             (mbedtls_mpi *)0x0,&T);
  if ((uVar1 == 0) && (uVar1 = mbedtls_asn1_write_mpi(p,start,&T), len = 0, -1 < (int)uVar1)) {
    uVar2 = mbedtls_rsa_export(rsa,&T,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                               (mbedtls_mpi *)0x0);
    if (uVar2 == 0) {
      uVar3 = mbedtls_asn1_write_mpi(p,start,&T);
      uVar2 = 0;
      if (0 < (int)uVar3) {
        uVar2 = uVar3;
      }
      len = (ulong)(uVar2 + uVar1);
      uVar1 = uVar3;
    }
    else {
      len = (ulong)uVar1;
      uVar1 = uVar2;
    }
  }
  mbedtls_mpi_free(&T);
  if (-1 < (int)uVar1) {
    uVar2 = mbedtls_asn1_write_len(p,start,len);
    uVar1 = uVar2;
    if ((-1 < (int)uVar2) && (uVar1 = mbedtls_asn1_write_tag(p,start,'0'), -1 < (int)uVar1)) {
      uVar1 = uVar2 + (int)len + uVar1;
    }
  }
  return uVar1;
}

Assistant:

int mbedtls_rsa_write_pubkey(const mbedtls_rsa_context *rsa, unsigned char *start,
                             unsigned char **p)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;
    mbedtls_mpi T;

    mbedtls_mpi_init(&T);

    /* Export E */
    if ((ret = mbedtls_rsa_export(rsa, NULL, NULL, NULL, NULL, &T)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

    /* Export N */
    if ((ret = mbedtls_rsa_export(rsa, &T, NULL, NULL, NULL, NULL)) != 0 ||
        (ret = mbedtls_asn1_write_mpi(p, start, &T)) < 0) {
        goto end_of_export;
    }
    len += ret;

end_of_export:

    mbedtls_mpi_free(&T);
    if (ret < 0) {
        return ret;
    }

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_len(p, start, len));
    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_tag(p, start, MBEDTLS_ASN1_CONSTRUCTED |
                                                     MBEDTLS_ASN1_SEQUENCE));

    return (int) len;
}